

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

void pageant_print_env(int pid)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  
  if (shell_type == ADDRTYPE_UNSPEC) {
    pcVar2 = getenv("SHELL");
    if (((pcVar2 == (char *)0x0) || (sVar3 = strlen(pcVar2), sVar3 < 3)) ||
       (iVar1 = strcmp(pcVar2 + (sVar3 - 3),"csh"), iVar1 != 0)) {
      shell_type = ADDRTYPE_IPV4;
    }
    else {
      shell_type = ADDRTYPE_IPV6;
    }
  }
  pcVar2 = "setenv SSH_AUTH_SOCK %s;\nsetenv SSH_AGENT_PID %d;\n";
  if (shell_type == ADDRTYPE_IPV4) {
    pcVar2 = "SSH_AUTH_SOCK=%s; export SSH_AUTH_SOCK;\nSSH_AGENT_PID=%d; export SSH_AGENT_PID;\n";
  }
  printf(pcVar2,socketname,pid);
  return;
}

Assistant:

void pageant_print_env(int pid)
{
    if (shell_type == SHELL_AUTO) {
        /* Same policy as OpenSSH: if $SHELL ends in "csh" then assume
         * it's csh-shaped. */
        const char *shell = getenv("SHELL");
        if (shell && strlen(shell) >= 3 &&
            !strcmp(shell + strlen(shell) - 3, "csh"))
            shell_type = SHELL_CSH;
        else
            shell_type = SHELL_SH;
    }

    /*
     * These shell snippets could usefully pay some attention to
     * escaping of interesting characters. I don't think it causes a
     * problem at the moment, because the pathnames we use are so
     * utterly boring, but it's a lurking bug waiting to happen once
     * a bit more flexibility turns up.
     */

    switch (shell_type) {
      case SHELL_SH:
        printf("SSH_AUTH_SOCK=%s; export SSH_AUTH_SOCK;\n"
               "SSH_AGENT_PID=%d; export SSH_AGENT_PID;\n",
               socketname, pid);
        break;
      case SHELL_CSH:
        printf("setenv SSH_AUTH_SOCK %s;\n"
               "setenv SSH_AGENT_PID %d;\n",
               socketname, pid);
        break;
      case SHELL_AUTO:
        unreachable("SHELL_AUTO should have been eliminated by now");
        break;
    }
}